

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb__wildmatch_raw2(char *expr,char *candidate,int search,int insensitive)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_4c;
  int local_48;
  int local_44;
  int local_38;
  int n;
  int z;
  int o;
  int start;
  int where;
  int insensitive_local;
  int search_local;
  char *candidate_local;
  char *expr_local;
  
  o = 0;
  z = -1;
  _insensitive_local = candidate;
  candidate_local = expr;
  if (search == 0) {
    if (*expr != '*') {
      z = 0;
    }
    for (; *candidate_local != '*'; candidate_local = candidate_local + 1) {
      if (*candidate_local == '\0') {
        if (*_insensitive_local != '\0') {
          return -1;
        }
        return 0;
      }
      if (*candidate_local == '?') {
        if (*_insensitive_local == '\0') {
          return -1;
        }
      }
      else if (insensitive == 0) {
        if (*_insensitive_local != *candidate_local) {
          return -1;
        }
      }
      else {
        iVar1 = tolower((int)*_insensitive_local);
        iVar2 = tolower((int)*candidate_local);
        if (iVar1 != iVar2) {
          return -1;
        }
      }
      _insensitive_local = _insensitive_local + 1;
      o = o + 1;
    }
  }
  else if (*expr == '\0') {
    return 0;
  }
  if ((search == 0) && (*candidate_local != '*')) {
    __assert_fail("search || *expr == \'*\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x22f2,"int stb__wildmatch_raw2(char *, char *, int, int)");
  }
  if (search == 0) {
    candidate_local = candidate_local + 1;
  }
  while( true ) {
    if (*candidate_local == '\0') {
      if (z < 0) {
        local_4c = 0;
      }
      else {
        local_4c = z;
      }
      return local_4c;
    }
    for (; *candidate_local == '*'; candidate_local = candidate_local + 1) {
    }
    if (*candidate_local == '\0') {
      if (z < 0) {
        local_44 = 0;
      }
      else {
        local_44 = z;
      }
      return local_44;
    }
    for (n = 0; (candidate_local[n] != '*' && (candidate_local[n] != '\0')); n = n + 1) {
    }
    if ((candidate_local[n] == '\0') && (search == 0)) {
      local_38 = 0;
      while( true ) {
        if (n <= local_38) {
          for (; _insensitive_local[local_38] != '\0'; local_38 = local_38 + 1) {
          }
          iVar1 = stb__match_qstring(_insensitive_local + ((long)local_38 - (long)n),candidate_local
                                     ,n,insensitive);
          if (iVar1 == 0) {
            expr_local._4_4_ = -1;
          }
          else {
            if (z < 0) {
              local_48 = 0;
            }
            else {
              local_48 = z;
            }
            expr_local._4_4_ = local_48;
          }
          return expr_local._4_4_;
        }
        if (_insensitive_local[local_38] == '\0') break;
        local_38 = local_38 + 1;
      }
      return -1;
    }
    iVar1 = stb__find_qstring(_insensitive_local,candidate_local,n,insensitive);
    if (iVar1 < 0) {
      return -1;
    }
    if (z < 0) {
      z = o + iVar1;
    }
    pcVar3 = candidate_local + n;
    _insensitive_local = _insensitive_local + (iVar1 + n);
    if (*pcVar3 == '\0') break;
    if (*pcVar3 != '*') {
      __assert_fail("*expr == \'*\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2325,"int stb__wildmatch_raw2(char *, char *, int, int)");
    }
    candidate_local = pcVar3 + 1;
  }
  if (search != 0) {
    return z;
  }
  __assert_fail("search",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0x2321,"int stb__wildmatch_raw2(char *, char *, int, int)");
}

Assistant:

int stb__wildmatch_raw2(char *expr, char *candidate, int search, int insensitive)
{
   int where=0;
   int start = -1;
   
   if (!search) {
      // parse to first '*'
      if (*expr != '*')
         start = 0;
      while (*expr != '*') {
         if (!*expr)
            return *candidate == 0 ? 0 : -1;
         if (*expr == '?') {
            if (!*candidate) return -1;
         } else {
            if (insensitive) {
               if (tolower(*candidate) != tolower(*expr))
                  return -1;
            } else 
               if (*candidate != *expr)
                  return -1;
         }
         ++candidate, ++expr, ++where;
      }
   } else {
      // 0-length search string
      if (!*expr)
         return 0;
   }

   assert(search || *expr == '*');
   if (!search)
      ++expr;

   // implicit '*' at this point
      
   while (*expr) {
      int o=0;
      // combine redundant * characters
      while (expr[0] == '*') ++expr;

      // ok, at this point, expr[-1] == '*',
      // and expr[0] != '*'

      if (!expr[0]) return start >= 0 ? start : 0;

      // now find next '*'
      o = 0;
      while (expr[o] != '*') {
         if (expr[o] == 0)
            break;
         ++o;
      }
      // if no '*', scan to end, then match at end
      if (expr[o] == 0 && !search) {
         int z;
         for (z=0; z < o; ++z)
            if (candidate[z] == 0)
               return -1;
         while (candidate[z])
            ++z;
         // ok, now check if they match
         if (stb__match_qstring(candidate+z-o, expr, o, insensitive))
            return start >= 0 ? start : 0;
         return -1; 
      } else {
         // if yes '*', then do stb__find_qmatch on the intervening chars
         int n = stb__find_qstring(candidate, expr, o, insensitive);
         if (n < 0)
            return -1;
         if (start < 0)
            start = where + n;
         expr += o;
         candidate += n+o;
      }

      if (*expr == 0) {
         assert(search);
         return start;
      }

      assert(*expr == '*');
      ++expr;
   }

   return start >= 0 ? start : 0;
}